

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewOrderList.h
# Opt level: O1

void __thiscall FIX42::NewOrderList::NoOrders::NoOrders(NoOrders *this)

{
  message_order local_30;
  
  FIX::message_order::message_order
            (&local_30,0xb,0x43,0xa0,0x6d,0x4c,1,0x4e,0x3f,0x40,0x15,0x12,0x6e,0x6f,100,0x182,0x51,
             0x37,0x41,0x30,0x16,0xa7,200,0xcd,0xc9,0xca,0xce,0xe7,0xdf,0xcf,0x6a,0x15c,0x15d,0x6b,
             0x15e,0x15f,0x8c,0x36,0x191,0x72,0x3c,0x26,0x98,0x28,0x2c,99,0xf,0x178,0x179,0x17,0x75,
             0x3b,0xa8,0x1b0,0x7e,0x1ab,0xc,0xd,0x2f,0x79,0x78,0x3a,0x162,0x163,0xc1,0xc0,0x4d,0xcb)
  ;
  FIX::FieldMap::FieldMap((FieldMap *)this,&local_30);
  *(undefined ***)&this->super_Group = &PTR__FieldMap_00325de8;
  (this->super_Group).m_field = 0x49;
  (this->super_Group).m_delim = 0xb;
  FIX::shared_array<int>::release(&local_30.m_groupOrder);
  *(undefined ***)&this->super_Group = &PTR__FieldMap_00326b58;
  return;
}

Assistant:

NoOrders() : FIX::Group(73,11,FIX::message_order(11,67,160,109,76,1,78,63,64,21,18,110,111,100,386,81,55,65,48,22,167,200,205,201,202,206,231,223,207,106,348,349,107,350,351,140,54,401,114,60,38,152,40,44,99,15,376,377,23,117,59,168,432,126,427,12,13,47,121,120,58,354,355,193,192,77,203,204,210,211,388,389,439,440,0)) {}